

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.h
# Opt level: O2

void pybind11::finalize_interpreter(void)

{
  PyTypeObject *pPVar1;
  internals *this;
  bool bVar2;
  internals **ppiVar3;
  handle *this_00;
  char *id;
  handle builtins;
  handle local_50;
  handle local_48;
  char *local_40;
  undefined8 local_38;
  item_accessor local_30;
  
  local_38 = PyEval_GetBuiltins();
  ppiVar3 = detail::get_internals_pp()::internals_pp;
  local_40 = "__pybind11_internals_v4_clang_libstdcpp_cxxabi1002__";
  bVar2 = detail::object_api<pybind11::handle>::contains<char_const*&>
                    ((object_api<pybind11::handle> *)&local_38,&local_40);
  if (bVar2) {
    detail::object_api<pybind11::handle>::operator[]
              (&local_30,(object_api<pybind11::handle> *)&local_38,local_40);
    detail::accessor::operator_cast_to_object((accessor *)&local_50);
    if (local_50.m_ptr == (PyObject *)0x0) {
      this_00 = &local_50;
    }
    else {
      pPVar1 = (local_50.m_ptr)->ob_type;
      object::~object((object *)&local_50);
      detail::accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_30);
      if (pPVar1 != (PyTypeObject *)&PyCapsule_Type) goto LAB_00112cd4;
      detail::object_api<pybind11::handle>::operator[]
                (&local_30,(object_api<pybind11::handle> *)&local_38,local_40);
      detail::accessor::operator_cast_to_object((accessor *)&local_48);
      local_50.m_ptr = local_48.m_ptr;
      local_48.m_ptr = (PyObject *)0x0;
      ppiVar3 = capsule::operator_cast_to_internals__((capsule *)&local_50);
      object::~object((object *)&local_50);
      this_00 = &local_48;
    }
    object::~object((object *)this_00);
    detail::accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_30);
  }
LAB_00112cd4:
  Py_Finalize();
  if (ppiVar3 != (internals **)0x0) {
    this = *ppiVar3;
    if (this != (internals *)0x0) {
      detail::internals::~internals(this);
    }
    operator_delete(this,0x1d8);
    *ppiVar3 = (internals *)0x0;
  }
  return;
}

Assistant:

inline void finalize_interpreter() {
    handle builtins(PyEval_GetBuiltins());
    const char *id = PYBIND11_INTERNALS_ID;

    // Get the internals pointer (without creating it if it doesn't exist).  It's possible for the
    // internals to be created during Py_Finalize() (e.g. if a py::capsule calls `get_internals()`
    // during destruction), so we get the pointer-pointer here and check it after Py_Finalize().
    detail::internals **internals_ptr_ptr = detail::get_internals_pp();
    // It could also be stashed in builtins, so look there too:
    if (builtins.contains(id) && isinstance<capsule>(builtins[id]))
        internals_ptr_ptr = capsule(builtins[id]);

    Py_Finalize();

    if (internals_ptr_ptr) {
        delete *internals_ptr_ptr;
        *internals_ptr_ptr = nullptr;
    }
}